

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O3

void __thiscall OpenMD::ForceManager::shortRangeInteractions(ForceManager *this)

{
  InversionType *pIVar1;
  int iVar2;
  RigidBody *this_00;
  Bond *this_01;
  pointer ppAVar3;
  long lVar4;
  Inversion *pIVar5;
  Snapshot *this_02;
  double dVar6;
  Molecule *pMVar7;
  _Rb_tree_header *p_Var8;
  _Base_ptr p_Var9;
  int iVar10;
  ulong uVar11;
  pointer ppBVar12;
  pointer ppBVar13;
  pointer ppTVar14;
  pointer ppIVar15;
  pointer ppRVar16;
  RealType angle;
  MoleculeIterator mi;
  double local_108;
  RealType local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet> local_d0;
  _Rb_tree_header *local_a0;
  _Rb_tree_header *local_98;
  _Rb_tree_header *local_90;
  _Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
  *local_88;
  _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
  *local_80;
  _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
  *local_78;
  MoleculeIterator local_70;
  potVec local_68;
  
  local_70._M_node = (_Base_ptr)0x0;
  pMVar7 = SimInfo::beginMolecule(this->info_,&local_70);
  if (pMVar7 == (Molecule *)0x0) {
    local_108 = 0.0;
    local_d8 = 0.0;
    local_e0 = 0.0;
    local_e8 = 0.0;
    local_f0 = 0.0;
  }
  else {
    local_78 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
                *)&this->bendDataSets;
    local_90 = &(this->bendDataSets)._M_t._M_impl.super__Rb_tree_header;
    local_80 = (_Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
                *)&this->torsionDataSets;
    local_98 = &(this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header;
    local_88 = (_Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
                *)&this->inversionDataSets;
    local_a0 = &(this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header;
    local_108 = 0.0;
    local_f0 = 0.0;
    local_e8 = 0.0;
    local_e0 = 0.0;
    local_d8 = 0.0;
    do {
      ppRVar16 = (pMVar7->rigidBodies_).
                 super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppRVar16 !=
          (pMVar7->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = *ppRVar16;
        while (this_00 != (RigidBody *)0x0) {
          ppRVar16 = ppRVar16 + 1;
          RigidBody::updateAtoms(this_00);
          if (ppRVar16 ==
              (pMVar7->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_finish) break;
          this_00 = *ppRVar16;
        }
      }
      ppBVar12 = (pMVar7->bonds_).
                 super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppBVar12 !=
          (pMVar7->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        this_01 = *ppBVar12;
        while (this_01 != (Bond *)0x0) {
          ppBVar12 = ppBVar12 + 1;
          Bond::calcForce(this_01,this->doParticlePot_);
          if (this->doPotentialSelection_ == true) {
            ppAVar3 = (this_01->super_ShortRangeInteraction).atoms_.
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar2 = ((*ppAVar3)->super_StuntDouble).globalIndex_;
            uVar11 = (ulong)iVar2;
            iVar10 = iVar2 + 0x3f;
            if (-1 < (long)uVar11) {
              iVar10 = iVar2;
            }
            lVar4 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                              super__Bvector_base<std::allocator<bool>_>;
            if ((*(ulong *)(lVar4 + (long)(iVar10 >> 6) * 8 + -8 +
                           (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar11 & 0x3f) & 1) == 0) {
              iVar2 = (ppAVar3[1]->super_StuntDouble).globalIndex_;
              uVar11 = (ulong)iVar2;
              iVar10 = iVar2 + 0x3f;
              if (-1 < (long)uVar11) {
                iVar10 = iVar2;
              }
              if ((*(ulong *)(lVar4 + (long)(iVar10 >> 6) * 8 + -8 +
                             (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar11 & 0x3f) & 1) == 0) goto LAB_00211e9b;
            }
            local_108 = local_108 + this_01->potential_;
          }
LAB_00211e9b:
          local_f0 = local_f0 + this_01->potential_;
          if (ppBVar12 ==
              (pMVar7->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) break;
          this_01 = *ppBVar12;
        }
      }
      for (ppBVar13 = (pMVar7->bends_).
                      super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          (ppBVar13 !=
           (pMVar7->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
           _M_impl.super__Vector_impl_data._M_finish &&
          (pIVar5 = (Inversion *)*ppBVar13, pIVar5 != (Inversion *)0x0)); ppBVar13 = ppBVar13 + 1) {
        (*(pIVar5->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                  (pIVar5,&local_f8,(ulong)this->doParticlePot_);
        pIVar1 = pIVar5->inversionType_;
        p_Var9 = (this->bendDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var8 = local_90;
        if (p_Var9 == (_Base_ptr)0x0) {
LAB_00211f32:
          local_d0.second.deltaV = 0.0;
          local_d0.second.prev.angle = local_f8;
          local_d0.second.curr.angle = local_f8;
          local_d0.first = pIVar5;
          local_d0.second.prev.potential = (RealType)pIVar1;
          local_d0.second.curr.potential = (RealType)pIVar1;
          std::
          _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
          ::_M_insert_unique<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>
                    (local_78,(pair<OpenMD::Bend_*const,_OpenMD::BendDataSet> *)&local_d0);
        }
        else {
          do {
            if (*(Inversion **)(p_Var9 + 1) >= pIVar5) {
              p_Var8 = (_Rb_tree_header *)p_Var9;
            }
            p_Var9 = (&p_Var9->_M_left)[*(Inversion **)(p_Var9 + 1) < pIVar5];
          } while (p_Var9 != (_Base_ptr)0x0);
          if ((p_Var8 == local_90) || (pIVar5 < (Inversion *)p_Var8->_M_node_count))
          goto LAB_00211f32;
          dVar6 = *(double *)((long)(p_Var8 + 1) + 0x20);
          *(undefined8 *)((long)(p_Var8 + 1) + 8) = *(undefined8 *)((long)(p_Var8 + 1) + 0x18);
          *(double *)((long)(p_Var8 + 1) + 0x10) = dVar6;
          *(RealType *)((long)(p_Var8 + 1) + 0x18) = local_f8;
          *(InversionType **)((long)(p_Var8 + 1) + 0x20) = pIVar1;
          *(double *)(p_Var8 + 1) = ABS((double)pIVar1 - dVar6);
        }
        if (this->doPotentialSelection_ == true) {
          ppAVar3 = (pIVar5->super_ShortRangeInteraction).atoms_.
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar2 = ((*ppAVar3)->super_StuntDouble).globalIndex_;
          uVar11 = (ulong)iVar2;
          iVar10 = iVar2 + 0x3f;
          if (-1 < (long)uVar11) {
            iVar10 = iVar2;
          }
          lVar4 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                              ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                            super__Bvector_base<std::allocator<bool>_>;
          if ((*(ulong *)(lVar4 + (long)(iVar10 >> 6) * 8 + -8 +
                         (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar11 & 0x3f) & 1) == 0) {
            iVar2 = (ppAVar3[1]->super_StuntDouble).globalIndex_;
            uVar11 = (ulong)iVar2;
            iVar10 = iVar2 + 0x3f;
            if (-1 < (long)uVar11) {
              iVar10 = iVar2;
            }
            if ((*(ulong *)(lVar4 + (long)(iVar10 >> 6) * 8 + -8 +
                           (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar11 & 0x3f) & 1) == 0) {
              iVar2 = (ppAVar3[2]->super_StuntDouble).globalIndex_;
              uVar11 = (ulong)iVar2;
              iVar10 = iVar2 + 0x3f;
              if (-1 < (long)uVar11) {
                iVar10 = iVar2;
              }
              if ((*(ulong *)(lVar4 + (long)(iVar10 >> 6) * 8 + -8 +
                             (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar11 & 0x3f) & 1) == 0) goto LAB_00212053;
            }
          }
          local_108 = local_108 + (double)pIVar5->inversionType_;
        }
LAB_00212053:
        local_e8 = local_e8 + (double)pIVar1;
      }
      for (ppTVar14 = (pMVar7->torsions_).
                      super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          (ppTVar14 !=
           (pMVar7->torsions_).
           super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
           super__Vector_impl_data._M_finish &&
          (pIVar5 = (Inversion *)*ppTVar14, pIVar5 != (Inversion *)0x0)); ppTVar14 = ppTVar14 + 1) {
        (*(pIVar5->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                  (pIVar5,&local_f8,(ulong)this->doParticlePot_);
        pIVar1 = *(InversionType **)((long)&(pIVar5->name_).field_2 + 8);
        p_Var9 = (this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var8 = local_98;
        if (p_Var9 == (_Base_ptr)0x0) {
LAB_00212117:
          local_d0.second.deltaV = 0.0;
          local_d0.second.prev.angle = local_f8;
          local_d0.second.curr.angle = local_f8;
          local_d0.first = pIVar5;
          local_d0.second.prev.potential = (RealType)pIVar1;
          local_d0.second.curr.potential = (RealType)pIVar1;
          std::
          _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
          ::_M_insert_unique<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>
                    (local_80,(pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet> *)&local_d0);
        }
        else {
          do {
            if (*(Inversion **)(p_Var9 + 1) >= pIVar5) {
              p_Var8 = (_Rb_tree_header *)p_Var9;
            }
            p_Var9 = (&p_Var9->_M_left)[*(Inversion **)(p_Var9 + 1) < pIVar5];
          } while (p_Var9 != (_Base_ptr)0x0);
          if ((p_Var8 == local_98) || (pIVar5 < (Inversion *)p_Var8->_M_node_count))
          goto LAB_00212117;
          dVar6 = *(double *)((long)(p_Var8 + 1) + 0x20);
          *(undefined8 *)((long)(p_Var8 + 1) + 8) = *(undefined8 *)((long)(p_Var8 + 1) + 0x18);
          *(double *)((long)(p_Var8 + 1) + 0x10) = dVar6;
          *(RealType *)((long)(p_Var8 + 1) + 0x18) = local_f8;
          *(InversionType **)((long)(p_Var8 + 1) + 0x20) = pIVar1;
          *(double *)(p_Var8 + 1) = ABS((double)pIVar1 - dVar6);
        }
        if (this->doPotentialSelection_ == true) {
          ppAVar3 = (pIVar5->super_ShortRangeInteraction).atoms_.
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar2 = ((*ppAVar3)->super_StuntDouble).globalIndex_;
          uVar11 = (ulong)iVar2;
          iVar10 = iVar2 + 0x3f;
          if (-1 < (long)uVar11) {
            iVar10 = iVar2;
          }
          lVar4 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                              ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                            super__Bvector_base<std::allocator<bool>_>;
          if ((*(ulong *)(lVar4 + (long)(iVar10 >> 6) * 8 + -8 +
                         (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar11 & 0x3f) & 1) == 0) {
            iVar2 = (ppAVar3[1]->super_StuntDouble).globalIndex_;
            uVar11 = (ulong)iVar2;
            iVar10 = iVar2 + 0x3f;
            if (-1 < (long)uVar11) {
              iVar10 = iVar2;
            }
            if ((*(ulong *)(lVar4 + (long)(iVar10 >> 6) * 8 + -8 +
                           (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar11 & 0x3f) & 1) == 0) {
              iVar2 = (ppAVar3[2]->super_StuntDouble).globalIndex_;
              uVar11 = (ulong)iVar2;
              iVar10 = iVar2 + 0x3f;
              if (-1 < (long)uVar11) {
                iVar10 = iVar2;
              }
              if ((*(ulong *)(lVar4 + (long)(iVar10 >> 6) * 8 + -8 +
                             (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar11 & 0x3f) & 1) == 0) {
                iVar2 = (ppAVar3[3]->super_StuntDouble).globalIndex_;
                uVar11 = (ulong)iVar2;
                iVar10 = iVar2 + 0x3f;
                if (-1 < (long)uVar11) {
                  iVar10 = iVar2;
                }
                if ((*(ulong *)(lVar4 + (long)(iVar10 >> 6) * 8 + -8 +
                               (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                     (uVar11 & 0x3f) & 1) == 0) goto LAB_00212275;
              }
            }
          }
          local_108 = local_108 + *(double *)((long)&(pIVar5->name_).field_2 + 8);
        }
LAB_00212275:
        local_e0 = local_e0 + (double)pIVar1;
      }
      for (ppIVar15 = (pMVar7->inversions_).
                      super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          (ppIVar15 !=
           (pMVar7->inversions_).
           super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
           super__Vector_impl_data._M_finish && (pIVar5 = *ppIVar15, pIVar5 != (Inversion *)0x0));
          ppIVar15 = ppIVar15 + 1) {
        (*(pIVar5->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                  (pIVar5,&local_f8,(ulong)this->doParticlePot_);
        pIVar1 = (InversionType *)pIVar5->potential_;
        p_Var9 = (this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var8 = local_a0;
        if (p_Var9 == (_Base_ptr)0x0) {
LAB_00212339:
          local_d0.second.deltaV = 0.0;
          local_d0.second.prev.angle = local_f8;
          local_d0.second.curr.angle = local_f8;
          local_d0.first = pIVar5;
          local_d0.second.prev.potential = (RealType)pIVar1;
          local_d0.second.curr.potential = (RealType)pIVar1;
          std::
          _Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
          ::_M_insert_unique<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>
                    (local_88,&local_d0);
        }
        else {
          do {
            if (*(Inversion **)(p_Var9 + 1) >= pIVar5) {
              p_Var8 = (_Rb_tree_header *)p_Var9;
            }
            p_Var9 = (&p_Var9->_M_left)[*(Inversion **)(p_Var9 + 1) < pIVar5];
          } while (p_Var9 != (_Base_ptr)0x0);
          if ((p_Var8 == local_a0) || (pIVar5 < (Inversion *)p_Var8->_M_node_count))
          goto LAB_00212339;
          dVar6 = *(double *)((long)(p_Var8 + 1) + 0x20);
          *(undefined8 *)((long)(p_Var8 + 1) + 8) = *(undefined8 *)((long)(p_Var8 + 1) + 0x18);
          *(double *)((long)(p_Var8 + 1) + 0x10) = dVar6;
          *(RealType *)((long)(p_Var8 + 1) + 0x18) = local_f8;
          *(InversionType **)((long)(p_Var8 + 1) + 0x20) = pIVar1;
          *(double *)(p_Var8 + 1) = ABS((double)pIVar1 - dVar6);
        }
        if (this->doPotentialSelection_ == true) {
          ppAVar3 = (pIVar5->super_ShortRangeInteraction).atoms_.
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar2 = ((*ppAVar3)->super_StuntDouble).globalIndex_;
          uVar11 = (ulong)iVar2;
          iVar10 = iVar2 + 0x3f;
          if (-1 < (long)uVar11) {
            iVar10 = iVar2;
          }
          lVar4 = *(long *)&(((this->seleMan_).ss_.bitsets_.
                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                              ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                            super__Bvector_base<std::allocator<bool>_>;
          if ((*(ulong *)(lVar4 + (long)(iVar10 >> 6) * 8 + -8 +
                         (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar11 & 0x3f) & 1) == 0) {
            iVar2 = (ppAVar3[1]->super_StuntDouble).globalIndex_;
            uVar11 = (ulong)iVar2;
            iVar10 = iVar2 + 0x3f;
            if (-1 < (long)uVar11) {
              iVar10 = iVar2;
            }
            if ((*(ulong *)(lVar4 + (long)(iVar10 >> 6) * 8 + -8 +
                           (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar11 & 0x3f) & 1) == 0) {
              iVar2 = (ppAVar3[2]->super_StuntDouble).globalIndex_;
              uVar11 = (ulong)iVar2;
              iVar10 = iVar2 + 0x3f;
              if (-1 < (long)uVar11) {
                iVar10 = iVar2;
              }
              if ((*(ulong *)(lVar4 + (long)(iVar10 >> 6) * 8 + -8 +
                             (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                   (uVar11 & 0x3f) & 1) == 0) {
                iVar2 = (ppAVar3[3]->super_StuntDouble).globalIndex_;
                uVar11 = (ulong)iVar2;
                iVar10 = iVar2 + 0x3f;
                if (-1 < (long)uVar11) {
                  iVar10 = iVar2;
                }
                if ((*(ulong *)(lVar4 + (long)(iVar10 >> 6) * 8 + -8 +
                               (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                     (uVar11 & 0x3f) & 1) == 0) goto LAB_00212497;
              }
            }
          }
          local_108 = local_108 + pIVar5->potential_;
        }
LAB_00212497:
        local_d8 = local_d8 + (double)pIVar1;
      }
      pMVar7 = SimInfo::nextMolecule(this->info_,&local_70);
    } while (pMVar7 != (Molecule *)0x0);
  }
  this_02 = this->info_->sman_->currentSnapshot_;
  (*this->fDecomp_->_vptr_ForceDecomposition[2])(this->fDecomp_,this_02);
  Snapshot::setBondPotential(this_02,local_f0);
  Snapshot::setBendPotential(this_02,local_e8);
  Snapshot::setTorsionPotential(this_02,local_e0);
  Snapshot::setInversionPotential(this_02,local_d8);
  local_68.data_[4] = 0.0;
  local_68.data_[5] = 0.0;
  local_68.data_[2] = 0.0;
  local_68.data_[3] = 0.0;
  local_68.data_[0] = 0.0;
  local_68.data_[1] = 0.0;
  local_68.data_[6] = local_108;
  Snapshot::setSelectionPotentials(this_02,&local_68);
  return;
}

Assistant:

void ForceManager::shortRangeInteractions() {
    Molecule* mol;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    SimInfo::MoleculeIterator mi;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;

    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;
    RealType bondPotential      = 0.0;
    RealType bendPotential      = 0.0;
    RealType torsionPotential   = 0.0;
    RealType inversionPotential = 0.0;
    potVec selectionPotential(0.0);

    // calculate short range interactions
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      // change the positions of atoms which belong to the rigidbodies
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        rb->updateAtoms();
      }

      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bond->calcForce(doParticlePot_);
        bondPotential += bond->getPotential();
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(bond->getAtomA()) ||
              seleMan_.isSelected(bond->getAtomB())) {
            selectionPotential[BONDED_FAMILY] += bond->getPotential();
          }
        }
      }

      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        RealType angle;
        bend->calcForce(angle, doParticlePot_);
        RealType currBendPot = bend->getPotential();

        bendPotential += bend->getPotential();
        map<Bend*, BendDataSet>::iterator i = bendDataSets.find(bend);
        if (i == bendDataSets.end()) {
          BendDataSet dataSet;
          dataSet.prev.angle = dataSet.curr.angle = angle;
          dataSet.prev.potential = dataSet.curr.potential = currBendPot;
          dataSet.deltaV                                  = 0.0;
          bendDataSets.insert(
              map<Bend*, BendDataSet>::value_type(bend, dataSet));
        } else {
          i->second.prev.angle     = i->second.curr.angle;
          i->second.prev.potential = i->second.curr.potential;
          i->second.curr.angle     = angle;
          i->second.curr.potential = currBendPot;
          i->second.deltaV =
              fabs(i->second.curr.potential - i->second.prev.potential);
        }
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(bend->getAtomA()) ||
              seleMan_.isSelected(bend->getAtomB()) ||
              seleMan_.isSelected(bend->getAtomC())) {
            selectionPotential[BONDED_FAMILY] += bend->getPotential();
          }
        }
      }

      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        RealType angle;
        torsion->calcForce(angle, doParticlePot_);
        RealType currTorsionPot = torsion->getPotential();
        torsionPotential += torsion->getPotential();
        map<Torsion*, TorsionDataSet>::iterator i =
            torsionDataSets.find(torsion);
        if (i == torsionDataSets.end()) {
          TorsionDataSet dataSet;
          dataSet.prev.angle = dataSet.curr.angle = angle;
          dataSet.prev.potential = dataSet.curr.potential = currTorsionPot;
          dataSet.deltaV                                  = 0.0;
          torsionDataSets.insert(
              map<Torsion*, TorsionDataSet>::value_type(torsion, dataSet));
        } else {
          i->second.prev.angle     = i->second.curr.angle;
          i->second.prev.potential = i->second.curr.potential;
          i->second.curr.angle     = angle;
          i->second.curr.potential = currTorsionPot;
          i->second.deltaV =
              fabs(i->second.curr.potential - i->second.prev.potential);
        }
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(torsion->getAtomA()) ||
              seleMan_.isSelected(torsion->getAtomB()) ||
              seleMan_.isSelected(torsion->getAtomC()) ||
              seleMan_.isSelected(torsion->getAtomD())) {
            selectionPotential[BONDED_FAMILY] += torsion->getPotential();
          }
        }
      }

      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        RealType angle;
        inversion->calcForce(angle, doParticlePot_);
        RealType currInversionPot = inversion->getPotential();
        inversionPotential += inversion->getPotential();
        map<Inversion*, InversionDataSet>::iterator i =
            inversionDataSets.find(inversion);
        if (i == inversionDataSets.end()) {
          InversionDataSet dataSet;
          dataSet.prev.angle = dataSet.curr.angle = angle;
          dataSet.prev.potential = dataSet.curr.potential = currInversionPot;
          dataSet.deltaV                                  = 0.0;
          inversionDataSets.insert(
              map<Inversion*, InversionDataSet>::value_type(inversion,
                                                            dataSet));
        } else {
          i->second.prev.angle     = i->second.curr.angle;
          i->second.prev.potential = i->second.curr.potential;
          i->second.curr.angle     = angle;
          i->second.curr.potential = currInversionPot;
          i->second.deltaV =
              fabs(i->second.curr.potential - i->second.prev.potential);
        }
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(inversion->getAtomA()) ||
              seleMan_.isSelected(inversion->getAtomB()) ||
              seleMan_.isSelected(inversion->getAtomC()) ||
              seleMan_.isSelected(inversion->getAtomD())) {
            selectionPotential[BONDED_FAMILY] += inversion->getPotential();
          }
        }
      }
    }

#ifdef IS_MPI
    // Collect from all nodes.  This should eventually be moved into a
    // SystemDecomposition, but this is a better place than in
    // Thermo to do the collection.

    MPI_Allreduce(MPI_IN_PLACE, &bondPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &bendPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &torsionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &inversionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &selectionPotential[BONDED_FAMILY], 1,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    fDecomp_->setSnapshot(curSnapshot);

    curSnapshot->setBondPotential(bondPotential);
    curSnapshot->setBendPotential(bendPotential);
    curSnapshot->setTorsionPotential(torsionPotential);
    curSnapshot->setInversionPotential(inversionPotential);
    curSnapshot->setSelectionPotentials(selectionPotential);

    // RealType shortRangePotential = bondPotential + bendPotential +
    //   torsionPotential +  inversionPotential;

    // curSnapshot->setShortRangePotential(shortRangePotential);
  }